

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void QGuiApplicationPrivate::processWindowSystemEvent(WindowSystemEvent *e)

{
  long lVar1;
  QCoreApplication *pQVar2;
  QEvent *this;
  ScreenLogicalDotsPerInchEvent *e_00;
  long in_RDI;
  long in_FS_OFFSET;
  FocusWindowEvent *unaff_retaddr;
  FlushEventsEvent *flushEventsEvent;
  ApplicationStateChangedEvent *changeEvent;
  MouseEvent *in_stack_000000b0;
  TouchEvent *in_stack_000001f0;
  PaintEvent *in_stack_ffffffffffffff98;
  int t;
  QDebug *in_stack_ffffffffffffffa0;
  ApplicationState state;
  ScreenGeometryEvent *in_stack_ffffffffffffffb0;
  ExposeEvent *in_stack_ffffffffffffffb8;
  WheelEvent *in_stack_ffffffffffffffc8;
  EnterEvent *in_stack_ffffffffffffffd0;
  GeometryChangeEvent *in_stack_ffffffffffffffd8;
  QDebug in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  e_00 = (ScreenLogicalDotsPerInchEvent *)(ulong)(*(int *)(in_RDI + 8) - 2);
  state = (ApplicationState)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  switch(e_00) {
  case (ScreenLogicalDotsPerInchEvent *)0x0:
    processGeometryChangeEvent(in_stack_ffffffffffffffd8);
    break;
  default:
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffffb0,(char *)e_00,state,
               (char *)in_stack_ffffffffffffff98);
    t = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    QMessageLogger::warning();
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffe8.stream)
    ;
    QDebug::operator<<(in_stack_ffffffffffffffa0,t);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe8);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x3:
    processFocusWindowEvent(unaff_retaddr);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x4:
    processWindowStateChangedEvent((WindowStateChangedEvent *)in_stack_ffffffffffffffb0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0xa:
    processScreenOrientationChange((ScreenOrientationEvent *)in_stack_ffffffffffffffb8);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0xb:
    processScreenGeometryChange(in_stack_ffffffffffffffb0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0xd:
    processScreenLogicalDotsPerInchChange(e_00);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0xe:
    processScreenRefreshRateChange((ScreenRefreshRateEvent *)in_stack_ffffffffffffffb0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0xf:
    processThemeChanged((ThemeChangeEvent *)in_stack_ffffffffffffff98);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x10:
    processExposeEvent(in_stack_ffffffffffffffb8);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x17:
    setApplicationState(state,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x18,0));
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x1e:
    QWindowSystemInterface::deferredFlushWindowSystemEvents
              ((QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)
               SUB84((ulong)in_stack_ffffffffffffff98 >> 0x20,0));
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x1f:
    processWindowScreenChangedEvent((WindowScreenChangedEvent *)in_stack_ffffffffffffffb0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x20:
    processSafeAreaMarginsChangedEvent((SafeAreaMarginsChangedEvent *)e_00);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x21:
    processApplicationTermination(&in_stack_ffffffffffffff98->super_WindowSystemEvent);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x22:
    processPaintEvent(in_stack_ffffffffffffff98);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x23:
    processWindowDevicePixelRatioChangedEvent((WindowDevicePixelRatioChangedEvent *)0x365d2e);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0xff:
    processCloseEvent((CloseEvent *)in_stack_ffffffffffffff98);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x101:
    processEnterEvent(in_stack_ffffffffffffffd0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x102:
    processLeaveEvent((LeaveEvent *)in_stack_ffffffffffffff98);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x105:
    processMouseEvent(in_stack_000000b0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x107:
    processWheelEvent(in_stack_ffffffffffffffc8);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x108:
    processKeyEvent((KeyEvent *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x109:
    processTouchEvent(in_stack_000001f0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x111:
    processFileOpenEvent((FileOpenEvent *)in_stack_ffffffffffffff98);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x112:
    processTabletEvent((TabletEvent *)e);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x113:
    processTabletEnterProximityEvent((TabletEnterProximityEvent *)in_stack_ffffffffffffffc8);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x114:
    processTabletLeaveProximityEvent((TabletLeaveProximityEvent *)in_stack_ffffffffffffffc8);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x115:
    processPlatformPanelEvent((PlatformPanelEvent *)in_stack_ffffffffffffff98);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x116:
    processContextMenuEvent((ContextMenuEvent *)0x365e7a);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x117:
    pQVar2 = QCoreApplication::instance();
    this = (QEvent *)operator_new(0x10);
    QEvent::QEvent(this,EnterWhatsThisMode);
    QCoreApplication::postEvent((QObject *)pQVar2,(QEvent *)this,0);
    break;
  case (ScreenLogicalDotsPerInchEvent *)0x118:
    processGestureEvent((GestureEvent *)in_stack_ffffffffffffffe8.stream);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGuiApplicationPrivate::processWindowSystemEvent(QWindowSystemInterfacePrivate::WindowSystemEvent *e)
{
    Q_TRACE_PARAM_REPLACE(QWindowSystemInterfacePrivate::WindowSystemEvent *, int);
    Q_TRACE_SCOPE(QGuiApplicationPrivate_processWindowSystemEvent, e->type);

    switch(e->type) {
    case QWindowSystemInterfacePrivate::Mouse:
        QGuiApplicationPrivate::processMouseEvent(static_cast<QWindowSystemInterfacePrivate::MouseEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Wheel:
        QGuiApplicationPrivate::processWheelEvent(static_cast<QWindowSystemInterfacePrivate::WheelEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Key:
        QGuiApplicationPrivate::processKeyEvent(static_cast<QWindowSystemInterfacePrivate::KeyEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Touch:
        QGuiApplicationPrivate::processTouchEvent(static_cast<QWindowSystemInterfacePrivate::TouchEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::GeometryChange:
        QGuiApplicationPrivate::processGeometryChangeEvent(static_cast<QWindowSystemInterfacePrivate::GeometryChangeEvent*>(e));
        break;
    case QWindowSystemInterfacePrivate::Enter:
        QGuiApplicationPrivate::processEnterEvent(static_cast<QWindowSystemInterfacePrivate::EnterEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Leave:
        QGuiApplicationPrivate::processLeaveEvent(static_cast<QWindowSystemInterfacePrivate::LeaveEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::FocusWindow:
        QGuiApplicationPrivate::processFocusWindowEvent(static_cast<QWindowSystemInterfacePrivate::FocusWindowEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowStateChanged:
        QGuiApplicationPrivate::processWindowStateChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowStateChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowScreenChanged:
        QGuiApplicationPrivate::processWindowScreenChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowScreenChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowDevicePixelRatioChanged:
        QGuiApplicationPrivate::processWindowDevicePixelRatioChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowDevicePixelRatioChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::SafeAreaMarginsChanged:
        QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(static_cast<QWindowSystemInterfacePrivate::SafeAreaMarginsChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ApplicationStateChanged: {
        QWindowSystemInterfacePrivate::ApplicationStateChangedEvent * changeEvent = static_cast<QWindowSystemInterfacePrivate::ApplicationStateChangedEvent *>(e);
        QGuiApplicationPrivate::setApplicationState(changeEvent->newState, changeEvent->forcePropagate); }
        break;
    case QWindowSystemInterfacePrivate::ApplicationTermination:
        QGuiApplicationPrivate::processApplicationTermination(e);
        break;
    case QWindowSystemInterfacePrivate::FlushEvents: {
        QWindowSystemInterfacePrivate::FlushEventsEvent *flushEventsEvent = static_cast<QWindowSystemInterfacePrivate::FlushEventsEvent *>(e);
        QWindowSystemInterface::deferredFlushWindowSystemEvents(flushEventsEvent->flags); }
        break;
    case QWindowSystemInterfacePrivate::Close:
        QGuiApplicationPrivate::processCloseEvent(
                static_cast<QWindowSystemInterfacePrivate::CloseEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenOrientation:
        QGuiApplicationPrivate::processScreenOrientationChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenOrientationEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenGeometry:
        QGuiApplicationPrivate::processScreenGeometryChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenGeometryEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInch:
        QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenRefreshRate:
        QGuiApplicationPrivate::processScreenRefreshRateChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenRefreshRateEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ThemeChange:
        QGuiApplicationPrivate::processThemeChanged(
                    static_cast<QWindowSystemInterfacePrivate::ThemeChangeEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Expose:
        QGuiApplicationPrivate::processExposeEvent(static_cast<QWindowSystemInterfacePrivate::ExposeEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Paint:
        QGuiApplicationPrivate::processPaintEvent(static_cast<QWindowSystemInterfacePrivate::PaintEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Tablet:
        QGuiApplicationPrivate::processTabletEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::TabletEnterProximity:
        QGuiApplicationPrivate::processTabletEnterProximityEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletEnterProximityEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::TabletLeaveProximity:
        QGuiApplicationPrivate::processTabletLeaveProximityEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletLeaveProximityEvent *>(e));
        break;
#ifndef QT_NO_GESTURES
    case QWindowSystemInterfacePrivate::Gesture:
        QGuiApplicationPrivate::processGestureEvent(
                    static_cast<QWindowSystemInterfacePrivate::GestureEvent *>(e));
        break;
#endif
    case QWindowSystemInterfacePrivate::PlatformPanel:
        QGuiApplicationPrivate::processPlatformPanelEvent(
                    static_cast<QWindowSystemInterfacePrivate::PlatformPanelEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::FileOpen:
        QGuiApplicationPrivate::processFileOpenEvent(
                    static_cast<QWindowSystemInterfacePrivate::FileOpenEvent *>(e));
        break;
#ifndef QT_NO_CONTEXTMENU
        case QWindowSystemInterfacePrivate::ContextMenu:
        QGuiApplicationPrivate::processContextMenuEvent(
                    static_cast<QWindowSystemInterfacePrivate::ContextMenuEvent *>(e));
        break;
#endif
    case QWindowSystemInterfacePrivate::EnterWhatsThisMode:
        QGuiApplication::postEvent(QGuiApplication::instance(), new QEvent(QEvent::EnterWhatsThisMode));
        break;
    default:
        qWarning() << "Unknown user input event type:" << e->type;
        break;
    }
}